

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

bool __thiscall
wallet::LegacyDataSPKM::GetPubKey(LegacyDataSPKM *this,CKeyID *address,CPubKey *vchPubKeyOut)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  const_iterator cVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock36;
  unique_lock<std::recursive_mutex> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_device = &(this->super_FillableSigningProvider).cs_KeyStore.super_recursive_mutex;
  local_38._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_38);
  iVar3 = (*((this->super_ScriptPubKeyMan).m_storage)->_vptr_WalletStorage[9])();
  if ((char)iVar3 == '\0') {
    bVar1 = FillableSigningProvider::GetPubKey
                      (&this->super_FillableSigningProvider,address,vchPubKeyOut);
    bVar2 = true;
    if (!bVar1) {
      bVar2 = GetWatchPubKey(this,address,vchPubKeyOut);
    }
  }
  else {
    cVar4 = std::
            _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
            ::find(&(this->mapCryptedKeys)._M_t,address);
    if ((_Rb_tree_header *)cVar4._M_node ==
        &(this->mapCryptedKeys)._M_t._M_impl.super__Rb_tree_header) {
      bVar2 = GetWatchPubKey(this,address,vchPubKeyOut);
    }
    else {
      memcpy(vchPubKeyOut,&cVar4._M_node[1]._M_right,0x41);
      bVar2 = true;
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool LegacyDataSPKM::GetPubKey(const CKeyID &address, CPubKey& vchPubKeyOut) const
{
    LOCK(cs_KeyStore);
    if (!m_storage.HasEncryptionKeys()) {
        if (!FillableSigningProvider::GetPubKey(address, vchPubKeyOut)) {
            return GetWatchPubKey(address, vchPubKeyOut);
        }
        return true;
    }

    CryptedKeyMap::const_iterator mi = mapCryptedKeys.find(address);
    if (mi != mapCryptedKeys.end())
    {
        vchPubKeyOut = (*mi).second.first;
        return true;
    }
    // Check for watch-only pubkeys
    return GetWatchPubKey(address, vchPubKeyOut);
}